

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O2

float __thiscall ConvexDecomposition::CTri::getVolume(CTri *this,ConvexDecompInterface *callback)

{
  uint uVar1;
  long lVar2;
  float fVar3;
  int aiStack_90 [2];
  uint indices [24];
  
  indices[0] = 0;
  indices[1] = 1;
  indices[2] = 2;
  indices[3] = 3;
  indices[4] = 4;
  indices[5] = 5;
  indices[6] = 0;
  indices[7] = 3;
  indices[8] = 4;
  indices[9] = 0;
  indices[10] = 4;
  indices[0xb] = 1;
  indices[0xc] = 1;
  indices[0xd] = 4;
  indices[0xe] = 5;
  indices[0xf] = 1;
  indices[0x10] = 5;
  indices[0x11] = 2;
  indices[0x12] = 0;
  indices[0x13] = 3;
  indices[0x14] = 5;
  indices[0x15] = 0;
  indices[0x16] = 5;
  indices[0x17] = 2;
  if (callback != (ConvexDecompInterface *)0x0) {
    aiStack_90[0] = 0xe2dfea;
    aiStack_90[1] = 0;
    uVar1 = getDebugColor();
    for (lVar2 = 8; lVar2 != 0x68; lVar2 = lVar2 + 0xc) {
      aiStack_90[0] = 0xe2e01b;
      aiStack_90[1] = 0;
      (*callback->_vptr_ConvexDecompInterface[2])
                (callback,&(this->mP1).x + (uint)(*(int *)((long)indices + lVar2 + -8) * 3),
                 &(this->mP1).x + (uint)(*(int *)((long)indices + lVar2 + -4) * 3),
                 &(this->mP1).x + (uint)(*(int *)((long)indices + lVar2) * 3),(ulong)uVar1);
    }
  }
  aiStack_90[0] = 0xe2e032;
  aiStack_90[1] = 0;
  fVar3 = computeMeshVolume((float *)this,8,indices);
  return fVar3;
}

Assistant:

float getVolume(ConvexDecompInterface *callback) const
	{
		unsigned int indices[8*3];


    unsigned int tcount = 0;

    addTri(indices,0,1,2,tcount);
    addTri(indices,3,4,5,tcount);

    addTri(indices,0,3,4,tcount);
    addTri(indices,0,4,1,tcount);

    addTri(indices,1,4,5,tcount);
    addTri(indices,1,5,2,tcount);

    addTri(indices,0,3,5,tcount);
    addTri(indices,0,5,2,tcount);

    const float *vertices = mP1.Ptr();

		if ( callback )
		{
			unsigned int color = getDebugColor();

#if 0
  		Vector3d d1 = mNear1;
  		Vector3d d2 = mNear2;
	  	Vector3d d3 = mNear3;

  		callback->ConvexDebugPoint(mP1.Ptr(),0.01f,0x00FF00);
  		callback->ConvexDebugPoint(mP2.Ptr(),0.01f,0x00FF00);
  		callback->ConvexDebugPoint(mP3.Ptr(),0.01f,0x00FF00);
  		callback->ConvexDebugPoint(d1.Ptr(),0.01f,0xFF0000);
  		callback->ConvexDebugPoint(d2.Ptr(),0.01f,0xFF0000);
  		callback->ConvexDebugPoint(d3.Ptr(),0.01f,0xFF0000);

  		callback->ConvexDebugTri(mP1.Ptr(), d1.Ptr(),  d1.Ptr(),0x00FF00);
  		callback->ConvexDebugTri(mP2.Ptr(), d2.Ptr(),  d2.Ptr(),0x00FF00);
  		callback->ConvexDebugTri(mP3.Ptr(), d3.Ptr(),  d3.Ptr(),0x00FF00);

#else
			for (unsigned int i=0; i<tcount; i++)
			{
				unsigned int i1 = indices[i*3+0];
				unsigned int i2 = indices[i*3+1];
				unsigned int i3 = indices[i*3+2];

				const float *p1 = &vertices[ i1*3 ];
				const float *p2 = &vertices[ i2*3 ];
				const float *p3 = &vertices[ i3*3 ];

				callback->ConvexDebugTri(p1,p2,p3,color);

			}
#endif
		}

		float v = computeMeshVolume(mP1.Ptr(), tcount, indices );

		return v;

	}